

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O1

double tinv(double p,int df)

{
  char *__format;
  byte bVar1;
  ulong uVar2;
  double dVar3;
  
  if (df < 1) {
    __format = "Degree Of Freedom should be a positive real integer";
  }
  else {
    if ((0.0 <= p) && (p <= 1.0)) {
      bVar1 = ~(0.0 < p && p < 1.0);
      if ((bool)(1000 < df | bVar1 & 1)) {
        dVar3 = *(double *)(&DAT_00155940 + (ulong)(-(uint)(p == 1.0) & 1) * 8);
      }
      else {
        uVar2 = -(ulong)(p <= 1.0 - p);
        dVar3 = (double)(uVar2 & (ulong)p | ~uVar2 & (ulong)(1.0 - p));
        dVar3 = betainv(dVar3 + dVar3,(double)df * 0.5,0.5);
        dVar3 = ((1.0 - dVar3) * (double)df) / dVar3;
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
      }
      if (bVar1 != 0 || df < 0x3e9) {
        return dVar3;
      }
      dVar3 = tinv_appx(p,df);
      return dVar3;
    }
    __format = "Probablity Values can only take values between 0.0 and 1.0";
  }
  printf(__format);
  exit(1);
}

Assistant:

double tinv(double p, int df) {
	double t,q,pmin,x,y,d2,sign;
	
	if (df <= 0) {
		printf("Degree Of Freedom should be a positive real integer");
		exit(1);
	}
	
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	}
	
	q = 1. - p;
	
	if ( p <= q ) {
		pmin = 2.0 * p;
	} else {
		pmin = 2.0 * q;
	}
	
	// XINFVAL value is set to 1.79e+308. It can be changed in erfunc.h file.
	
	if ( p == 0.) {
		t = -XINFVAL;
	}
	
	if ( p == 1.) {
		t = XINFVAL;
	}
	
	
	if ( p > 0. && p < 1. && df <= 1000 ) {
		if (p < 0.5) {
			sign = - 1.0;
		} else {
			sign = 1.0;
		}
		
		d2 = ((double) df ) / 2.0;
		x = betainv(pmin,d2,0.5);
		y = 1. - x;
		
		t = sqrt( (double) df * y / x);
	}
	
	if ( p > 0. && p < 1. && df > 1000 ) {
		t = tinv_appx(p,df);
	}
	
	return t;
}